

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::assignFacet
          (AbstractNumericFacetValidator *this,MemoryManager *manager)

{
  bool bVar1;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *toEnum;
  KVStringPair *toCopy;
  XMLCh *pXVar2;
  InvalidDatatypeFacetException *this_00;
  RuntimeException *anon_var_0_4;
  bool retStatus;
  uint val;
  NumberFormatException *anon_var_0_3;
  NumberFormatException *anon_var_0_2;
  NumberFormatException *anon_var_0_1;
  NumberFormatException *anon_var_0;
  XMLCh *value;
  KVStringPair pair;
  undefined1 local_58 [8];
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLCh *key;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets;
  MemoryManager *manager_local;
  AbstractNumericFacetValidator *this_local;
  
  toEnum = DatatypeValidator::getFacets(&this->super_DatatypeValidator);
  if (toEnum != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               local_58,toEnum,false,manager);
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                   hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                                    *)local_58), bVar1) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                            *)local_58);
      KVStringPair::KVStringPair((KVStringPair *)&value,toCopy);
      e.fMemoryManager = (MemoryManager *)KVStringPair::getKey((KVStringPair *)&value);
      anon_var_0 = (NumberFormatException *)KVStringPair::getValue((KVStringPair *)&value);
      bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (bVar1) {
        DatatypeValidator::setPattern(&this->super_DatatypeValidator,(XMLCh *)anon_var_0);
        pXVar2 = DatatypeValidator::getPattern(&this->super_DatatypeValidator);
        if (pXVar2 != (XMLCh *)0x0) {
          DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,8);
        }
      }
      else {
        bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,
                                  (XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE);
        if (bVar1) {
          (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x12])
                    (this,anon_var_0);
          DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x20);
        }
        else {
          bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,
                                    (XMLCh *)SchemaSymbols::fgELT_MAXEXCLUSIVE);
          if (bVar1) {
            (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x13])
                      (this,anon_var_0);
            DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x40);
          }
          else {
            bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,
                                      (XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE);
            if (bVar1) {
              (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x14])
                        (this,anon_var_0);
              DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x80);
            }
            else {
              bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,
                                        (XMLCh *)SchemaSymbols::fgELT_MINEXCLUSIVE);
              if (bVar1) {
                (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x15])
                          (this,anon_var_0);
                DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,0x100);
              }
              else {
                bVar1 = XMLString::equals((XMLCh *)e.fMemoryManager,
                                          (XMLCh *)SchemaSymbols::fgATT_FIXED);
                if (bVar1) {
                  anon_var_0_4._3_1_ =
                       XMLString::textToBin
                                 ((XMLCh *)anon_var_0,(uint *)((long)&anon_var_0_4 + 4),
                                  (this->super_DatatypeValidator).fMemoryManager);
                  if (!(bool)anon_var_0_4._3_1_) {
                    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
                    InvalidDatatypeFacetException::InvalidDatatypeFacetException
                              (this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                               ,0xe3,FACET_internalError_fixed,manager);
                    __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,
                                InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
                  }
                  DatatypeValidator::setFixed(&this->super_DatatypeValidator,anon_var_0_4._4_4_);
                }
                else {
                  (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xc])
                            (this,e.fMemoryManager,anon_var_0,manager);
                }
              }
            }
          }
        }
      }
      KVStringPair::~KVStringPair((KVStringPair *)&value);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               local_58);
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::assignFacet(MemoryManager* const manager)
{

    RefHashTableOf<KVStringPair>* facets = getFacets();

    if (!facets)     // no facets defined
        return;

    XMLCh* key;

    RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

    while (e.hasMoreElements())
    {
        KVStringPair pair = e.nextElement();
        key = pair.getKey();
        XMLCh* value = pair.getValue();

        if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
        {
            setPattern(value);
            if (getPattern())
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            // do not construct regex until needed
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
        {
            try
            {
                setMaxInclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MaxIncl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MAXINCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
        {
            try
            {
                setMaxExclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MaxExcl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MAXEXCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
        {
            try
            {
                setMinInclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MinIncl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MININCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
        {
            try
            {
                setMinExclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MinExcl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MINEXCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgATT_FIXED))
        {
            unsigned int val;
            bool         retStatus;
            try
            {
                retStatus = XMLString::textToBin(value, val, fMemoryManager);
            }
            catch (RuntimeException&)
            {
                ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_internalError_fixed, manager);
            }

            if (!retStatus)
            {
                ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_internalError_fixed, manager);
            }

            setFixed(val);
            //no setFacetsDefined here

        }
        else
        {
            assignAdditionalFacet(key, value, manager);
        }

    }//while

}